

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O2

int X509_add1_reject_object(X509 *x,ASN1_OBJECT *obj)

{
  enable_if_t<_internal::StackTraits<stack_st_ASN1_OBJECT>::kIsConst,_bool> eVar1;
  _Head_base<0UL,_asn1_object_st_*,_false> _Var2;
  X509_CERT_AUX *pXVar3;
  OPENSSL_STACK *sk;
  uint uVar4;
  UniquePtr<ASN1_OBJECT> objtmp;
  _Head_base<0UL,_asn1_object_st_*,_false> local_28;
  UniquePtr<typename_internal::StackTraits<stack_st_ASN1_OBJECT>::Type> local_20;
  
  _Var2._M_head_impl = (asn1_object_st *)OBJ_dup(obj);
  uVar4 = 0;
  local_28._M_head_impl = _Var2._M_head_impl;
  if ((ASN1_OBJECT *)_Var2._M_head_impl != (ASN1_OBJECT *)0x0) {
    pXVar3 = aux_get((X509 *)x);
    sk = (OPENSSL_STACK *)pXVar3->reject;
    if (sk == (OPENSSL_STACK *)0x0) {
      sk = OPENSSL_sk_new_null();
      pXVar3->reject = (stack_st_ASN1_OBJECT *)sk;
      uVar4 = 0;
      if (sk == (OPENSSL_STACK *)0x0) goto LAB_00195658;
    }
    local_28._M_head_impl = (asn1_object_st *)0x0;
    local_20._M_t.super___uniq_ptr_impl<asn1_object_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_object_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_object_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_object_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<asn1_object_st,_bssl::internal::Deleter,_true,_true>)_Var2._M_head_impl;
    eVar1 = bssl::PushToStack<stack_st_ASN1_OBJECT>((stack_st_ASN1_OBJECT *)sk,&local_20);
    uVar4 = (uint)eVar1;
    std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  }
LAB_00195658:
  std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<asn1_object_st,_bssl::internal::Deleter> *)&local_28);
  return uVar4;
}

Assistant:

int X509_add1_reject_object(X509 *x, const ASN1_OBJECT *obj) {
  bssl::UniquePtr<ASN1_OBJECT> objtmp(OBJ_dup(obj));
  if (objtmp == nullptr) {
    return 0;
  }
  X509_CERT_AUX *aux = aux_get(x);
  if (aux->reject == nullptr) {
    aux->reject = sk_ASN1_OBJECT_new_null();
    if (aux->reject == nullptr) {
      return 0;
    }
  }
  return bssl::PushToStack(aux->reject, std::move(objtmp));
}